

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_post_write_tile
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  opj_tcd *poVar2;
  OPJ_UINT32 OVar3;
  opj_stream_private_t *poVar4;
  OPJ_BOOL OVar5;
  OPJ_BOOL OVar6;
  OPJ_UINT32 OVar7;
  OPJ_SIZE_T OVar8;
  opj_j2k_t *poVar9;
  opj_j2k_t *poVar10;
  OPJ_UINT32 OVar11;
  ulong uVar12;
  OPJ_UINT32 OVar13;
  OPJ_BYTE *pOVar14;
  uint p_value;
  OPJ_BYTE *p_data;
  opj_event_mgr_t *poVar15;
  ulong uVar16;
  OPJ_UINT32 l_current_nb_bytes_written_1;
  OPJ_UINT32 l_current_nb_bytes_written;
  OPJ_UINT32 local_98;
  OPJ_UINT32 local_94;
  opj_j2k_t *local_90;
  OPJ_UINT32 local_84;
  undefined8 local_80;
  OPJ_BYTE *local_78;
  OPJ_UINT32 local_6c;
  ulong local_68;
  opj_tcp_t *local_60;
  opj_stream_private_t *local_58;
  opj_tcd *local_50;
  opj_event_mgr_t *local_48;
  ulong local_40;
  opj_cp_t *local_38;
  
  pOVar14 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
  if (pOVar14 == (OPJ_BYTE *)0x0) {
    __assert_fail("p_j2k->m_specific_param.m_encoder.m_encoded_tile_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x3133,
                  "OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  local_94 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size;
  poVar2 = p_j2k->m_tcd;
  poVar2->cur_pino = 0;
  (p_j2k->m_specific_param).m_decoder.m_state = 0;
  local_84 = 0;
  OVar5 = opj_j2k_write_sot(p_j2k,pOVar14,local_94,&local_84,p_stream,p_manager);
  OVar6 = 0;
  if (OVar5 != 0) {
    local_68 = (ulong)local_84;
    p_data = pOVar14 + local_68;
    OVar13 = local_94 - local_84;
    local_90 = p_j2k;
    local_80 = poVar2;
    local_78 = pOVar14;
    if ((3 < (ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U)) &&
       (((p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].field_0x1638 & 4) != 0)) {
      local_84 = 0;
      opj_j2k_write_poc_in_memory(p_j2k,p_data,&local_84,p_manager);
      p_data = p_data + local_84;
      OVar13 = OVar13 - local_84;
      local_68 = (ulong)((int)local_68 + local_84);
    }
    poVar9 = local_90;
    local_84 = 0;
    OVar5 = opj_j2k_write_sod(local_90,local_80,p_data,&local_84,OVar13,p_stream,p_manager);
    OVar6 = 0;
    if (OVar5 != 0) {
      p_value = (int)local_68 + local_84;
      opj_write_bytes_LE(local_78 + 6,p_value,4);
      poVar10 = poVar9;
      if ((poVar9->m_specific_param).m_encoder.m_TLM != 0) {
        opj_j2k_update_tlm(local_90,p_value);
        poVar10 = local_90;
      }
      pOVar14 = local_78 + p_value;
      local_94 = local_94 - p_value;
      local_50 = poVar10->m_tcd;
      local_60 = (poVar10->m_cp).tcps;
      local_40 = (ulong)poVar10->m_current_tile_number;
      local_68 = (ulong)p_value;
      local_38 = &poVar9->m_cp;
      local_6c = opj_j2k_get_num_tp(&poVar9->m_cp,0,poVar10->m_current_tile_number);
      pOVar1 = &(local_90->m_specific_param).m_encoder.m_current_tile_part_number;
      *pOVar1 = *pOVar1 + 1;
      poVar9 = local_90;
      OVar13 = local_94;
      local_58 = p_stream;
      local_48 = p_manager;
      if (local_6c < 2) {
        local_80 = (opj_tcd *)((ulong)local_80._4_4_ << 0x20);
      }
      else {
        OVar7 = 1;
        local_80 = (opj_tcd *)((ulong)local_80._4_4_ << 0x20);
        do {
          poVar15 = local_48;
          poVar4 = local_58;
          (poVar9->m_specific_param).m_decoder.m_state = OVar7;
          local_98 = 0;
          local_94 = OVar7;
          local_78 = pOVar14;
          OVar6 = opj_j2k_write_sot(poVar9,pOVar14,OVar13,&local_98,local_58,local_48);
          OVar7 = local_98;
          if (OVar6 == 0) {
            return 0;
          }
          pOVar14 = local_78 + local_98;
          OVar13 = OVar13 - local_98;
          local_98 = 0;
          OVar6 = opj_j2k_write_sod(poVar9,local_50,pOVar14,&local_98,OVar13,poVar4,poVar15);
          OVar3 = local_98;
          if (OVar6 == 0) {
            return 0;
          }
          uVar12 = (ulong)local_98;
          OVar11 = local_98 + OVar7;
          opj_write_bytes_LE(local_78 + 6,OVar11,4);
          if ((poVar9->m_specific_param).m_encoder.m_TLM != 0) {
            opj_j2k_update_tlm(local_90,OVar11);
            poVar9 = local_90;
          }
          pOVar14 = pOVar14 + uVar12;
          local_80 = (opj_tcd *)CONCAT44(local_80._4_4_,(int)local_80 + OVar7 + OVar3);
          pOVar1 = &(poVar9->m_specific_param).m_encoder.m_current_tile_part_number;
          *pOVar1 = *pOVar1 + 1;
          OVar13 = OVar13 - OVar3;
          OVar7 = local_94 + 1;
        } while (local_6c != OVar7);
      }
      poVar15 = local_48;
      if (local_60[local_40].numpocs != 0) {
        local_60 = (opj_tcp_t *)&local_60[local_40].numpocs;
        OVar7 = 1;
        do {
          local_50->cur_pino = OVar7;
          local_6c = OVar7;
          local_94 = opj_j2k_get_num_tp(local_38,OVar7,poVar9->m_current_tile_number);
          if (local_94 != 0) {
            OVar7 = 0;
            do {
              poVar4 = local_58;
              local_78 = (OPJ_BYTE *)CONCAT44(local_78._4_4_,OVar7);
              (local_90->m_specific_param).m_decoder.m_state = OVar7;
              local_98 = 0;
              OVar6 = opj_j2k_write_sot(local_90,pOVar14,OVar13,&local_98,local_58,poVar15);
              OVar7 = local_98;
              if (OVar6 == 0) {
                return 0;
              }
              uVar12 = (ulong)local_98;
              OVar13 = OVar13 - local_98;
              local_98 = 0;
              OVar6 = opj_j2k_write_sod(local_90,local_50,pOVar14 + uVar12,&local_98,OVar13,poVar4,
                                        poVar15);
              OVar3 = local_98;
              if (OVar6 == 0) {
                return 0;
              }
              uVar16 = (ulong)local_98;
              OVar11 = local_98 + OVar7;
              opj_write_bytes_LE(pOVar14 + 6,OVar11,4);
              if ((local_90->m_specific_param).m_encoder.m_TLM != 0) {
                opj_j2k_update_tlm(local_90,OVar11);
              }
              local_80 = (opj_tcd *)CONCAT44(local_80._4_4_,(int)local_80 + OVar7 + OVar3);
              pOVar14 = pOVar14 + uVar12 + uVar16;
              pOVar1 = &(local_90->m_specific_param).m_encoder.m_current_tile_part_number;
              *pOVar1 = *pOVar1 + 1;
              OVar13 = OVar13 - OVar3;
              OVar7 = (int)local_78 + 1;
              poVar15 = local_48;
            } while (local_94 != OVar7);
          }
          OVar7 = local_6c + 1;
          poVar9 = local_90;
        } while (OVar7 <= local_60->csty);
      }
      uVar12 = (ulong)(uint)((int)local_68 + (int)local_80);
      OVar8 = opj_stream_write_data
                        (local_58,(poVar9->m_specific_param).m_encoder.m_encoded_tile_data,uVar12,
                         poVar15);
      OVar6 = 0;
      if (OVar8 == uVar12) {
        poVar9->m_current_tile_number = poVar9->m_current_tile_number + 1;
        OVar6 = 1;
      }
    }
  }
  return OVar6;
}

Assistant:

static OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t * p_j2k,
                                        opj_stream_private_t *p_stream,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_nb_bytes_written;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_available_data;

    /* preconditions */
    assert(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);

    l_tile_size = p_j2k->m_specific_param.m_encoder.m_encoded_tile_size;
    l_available_data = l_tile_size;
    l_current_data = p_j2k->m_specific_param.m_encoder.m_encoded_tile_data;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_first_tile_part(p_j2k, l_current_data, &l_nb_bytes_written,
                                        l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }
    l_current_data += l_nb_bytes_written;
    l_available_data -= l_nb_bytes_written;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_all_tile_parts(p_j2k, l_current_data, &l_nb_bytes_written,
                                       l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_available_data -= l_nb_bytes_written;
    l_nb_bytes_written = l_tile_size - l_available_data;

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_encoded_tile_data,
                              l_nb_bytes_written, p_manager) != l_nb_bytes_written) {
        return OPJ_FALSE;
    }

    ++p_j2k->m_current_tile_number;

    return OPJ_TRUE;
}